

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O0

void __thiscall md::ROM::update_checksum(ROM *this)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  undefined2 local_1a;
  uint local_18;
  uint16_t word;
  uint8_t lsb;
  uint8_t msb;
  uint32_t addr;
  uint16_t checksum;
  ROM *this_local;
  
  _lsb = 0;
  local_18 = 0x200;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_byte_array);
    if (sVar2 <= local_18) break;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_byte_array,(ulong)local_18);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_byte_array,(ulong)(local_18 + 1));
    local_1a = CONCAT11(vVar1,*pvVar3);
    _lsb = _lsb + local_1a;
    local_18 = local_18 + 2;
  }
  set_word(this,0x18e,_lsb);
  return;
}

Assistant:

void ROM::update_checksum()
{
    uint16_t checksum = 0;
    for (uint32_t addr = 0x200; addr < _byte_array.size(); addr += 0x02)
    {
        uint8_t msb = _byte_array[addr];
        uint8_t lsb = _byte_array[addr + 1];
        uint16_t word = (uint16_t)(msb << 8) | lsb;
        checksum += word;
    }

    this->set_word(0x18E, checksum);
}